

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O1

QMessageLogContext * __thiscall
QMessageLogContext::copyContextFrom(QMessageLogContext *this,QMessageLogContext *logContext)

{
  char *pcVar1;
  
  this->category = logContext->category;
  this->line = logContext->line;
  pcVar1 = logContext->function;
  this->file = logContext->file;
  this->function = pcVar1;
  if (this->version == 3) {
    copyInternalContext((QInternalMessageLogContext *)this,logContext);
  }
  return this;
}

Assistant:

QMessageLogContext &QMessageLogContext::copyContextFrom(const QMessageLogContext &logContext) noexcept
{
    this->category = logContext.category;
    this->file = logContext.file;
    this->line = logContext.line;
    this->function = logContext.function;
    if (Q_UNLIKELY(version == CurrentVersion + 1))
        copyInternalContext(static_cast<QInternalMessageLogContext *>(this), logContext);
    return *this;
}